

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QRect __thiscall QTableView::visualRect(QTableView *this,QModelIndex *index)

{
  QTableViewPrivate *this_00;
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QRect QVar10;
  QRect QVar11;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  bVar1 = QAbstractItemViewPrivate::isIndexValid(&this_00->super_QAbstractItemViewPrivate,index);
  if (bVar1) {
    QModelIndex::parent(&local_48,index);
    bVar1 = ::operator!=(&local_48,&(this_00->super_QAbstractItemViewPrivate).root);
    if (!bVar1) {
      if ((QSpanCollection *)
          (this_00->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next == &this_00->spans) {
        cVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget + 0x2c0))(this,index);
        if (cVar2 != '\0') goto LAB_0052e214;
      }
      QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
      if ((QSpanCollection *)
          (this_00->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next == &this_00->spans) {
        uVar3 = rowViewportPosition(this,index->r);
        uVar9 = (ulong)uVar3;
        iVar4 = rowHeight(this,index->r);
        uVar5 = columnViewportPosition(this,index->c);
        QVar11.y1.m_i = 0;
        QVar11.x1.m_i = uVar5;
        iVar6 = columnWidth(this,index->c);
        uVar7 = ~(uint)*(byte *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea
                                           .super_QFrame.super_QWidget.field_0x8 + 0x540);
        QVar11.x2.m_i = iVar6 + uVar5 + uVar7;
        QVar11.y2.m_i = 0;
        uVar8 = (ulong)(iVar4 + uVar3 + uVar7);
      }
      else {
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m.ptr._0_1_ = true;
        local_48.m.ptr._1_3_ = 0xaaaaaa;
        QTableViewPrivate::span((Span *)&local_48,this_00,index->r,index->c);
        QVar11 = QTableViewPrivate::visualSpanRect(this_00,(Span *)&local_48);
        uVar9 = QVar11._0_8_ >> 0x20;
        uVar8 = QVar11._8_8_ >> 0x20;
      }
      goto LAB_0052e221;
    }
  }
LAB_0052e214:
  uVar9 = 0;
  uVar8 = 0xffffffffffffffff;
  QVar11 = (QRect)(ZEXT816(0xffffffff) << 0x40);
LAB_0052e221:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QVar10._0_8_ = QVar11._0_8_ & 0xffffffff | uVar9 << 0x20;
    QVar10._8_8_ = QVar11._8_8_ & 0xffffffff | uVar8 << 0x20;
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableView::visualRect(const QModelIndex &index) const
{
    Q_D(const QTableView);
    if (!d->isIndexValid(index) || index.parent() != d->root
        || (!d->hasSpans() && isIndexHidden(index)))
        return QRect();

    d->executePostedLayout();

    if (d->hasSpans()) {
        QSpanCollection::Span span = d->span(index.row(), index.column());
        return d->visualSpanRect(span);
    }

    int rowp = rowViewportPosition(index.row());
    int rowh = rowHeight(index.row());
    int colp = columnViewportPosition(index.column());
    int colw = columnWidth(index.column());

    const int i = showGrid() ? 1 : 0;
    return QRect(colp, rowp, colw - i, rowh - i);
}